

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall backward::ResolvedTrace::ResolvedTrace(ResolvedTrace *this,Trace *mini_trace)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  SourceLoc *this_00;
  
  uVar1 = in_RSI[1];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar1;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  this_00 = (SourceLoc *)(in_RDI + 6);
  std::__cxx11::string::string((string *)this_00);
  SourceLoc::SourceLoc(this_00);
  std::
  vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>::
  vector((vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
          *)0x2176e4);
  return;
}

Assistant:

ResolvedTrace(const Trace &mini_trace) : Trace(mini_trace) {}